

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O2

rf_image *
rf_image_format(rf_image *__return_storage_ptr__,rf_image image,
               rf_uncompressed_pixel_format new_format,rf_allocator allocator)

{
  rf_source_location rVar1;
  rf_source_location source_location;
  undefined1 auVar2 [24];
  int iVar3;
  void *dst;
  rf_allocator_proc *prVar4;
  undefined8 in_R9;
  uint uVar5;
  long in_FS_OFFSET;
  uint uStack_a4;
  rf_allocator allocator_local;
  
  prVar4 = allocator.allocator_proc;
  allocator_local.user_data = allocator.user_data;
  __return_storage_ptr__->format = 0;
  __return_storage_ptr__->valid = false;
  *(undefined3 *)&__return_storage_ptr__->field_0x15 = 0;
  __return_storage_ptr__->data = (void *)0x0;
  __return_storage_ptr__->width = 0;
  __return_storage_ptr__->height = 0;
  allocator_local.allocator_proc = prVar4;
  if (image.valid == true) {
    if (image.format - RF_UNCOMPRESSED_GRAYSCALE < 10 && new_format - RF_UNCOMPRESSED_GRAYSCALE < 10
       ) {
      iVar3 = rf_bytes_per_pixel(image.format);
      uVar5 = iVar3 * image.height * image.width;
      rVar1.proc_name._0_4_ = 0x173058;
      rVar1.file_name =
           "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      rVar1.proc_name._4_4_ = 0;
      rVar1.line_in_file = 0x3ea2;
      auVar2._8_8_ = (ulong)uStack_a4 << 0x20;
      auVar2._0_8_ = (long)(int)uVar5;
      auVar2._16_8_ = 0;
      dst = (*prVar4)(&allocator_local,rVar1,RF_AM_ALLOC,(rf_allocator_args)(auVar2 << 0x40));
      if (dst != (void *)0x0) {
        iVar3 = rf_pixel_buffer_size(image.width,image.height,image.format);
        rf_format_pixels(image.data,(long)iVar3,image.format,dst,(long)(int)uVar5,new_format);
        __return_storage_ptr__->data = dst;
        __return_storage_ptr__->width = image.width;
        __return_storage_ptr__->height = image.height;
        __return_storage_ptr__->format = new_format;
        __return_storage_ptr__->valid = true;
        return __return_storage_ptr__;
      }
      rf_log_impl(8,0x172bc3,(char *)0x2,(ulong)uVar5);
      *(char **)(in_FS_OFFSET + -0x450) =
           "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      *(char **)(in_FS_OFFSET + -0x448) = "rf_image_format";
      *(undefined8 *)(in_FS_OFFSET + -0x440) = 0x3eb2;
      *(undefined4 *)(in_FS_OFFSET + -0x438) = 2;
      return __return_storage_ptr__;
    }
    source_location.proc_name._0_4_ = 0x173058;
    source_location.file_name =
         "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    source_location.proc_name._4_4_ = 0;
    source_location.line_in_file = 0x3eb4;
    rf_log_impl(source_location,RF_LOG_TYPE_ERROR,
                "Cannot format compressed pixel formats. `image.format`: %d, `dst_format`: %d",1,
                (ulong)image.format,(ulong)new_format,in_R9);
    *(char **)(in_FS_OFFSET + -0x450) =
         "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    *(char **)(in_FS_OFFSET + -0x448) = "rf_image_format";
    *(undefined8 *)(in_FS_OFFSET + -0x440) = 0x3eb4;
  }
  else {
    rf_log_impl(8,0x172f3a,(char *)0x1);
    *(char **)(in_FS_OFFSET + -0x450) =
         "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    *(char **)(in_FS_OFFSET + -0x448) = "rf_image_format";
    *(undefined8 *)(in_FS_OFFSET + -0x440) = 0x3eb6;
  }
  *(undefined4 *)(in_FS_OFFSET + -0x438) = 1;
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_image rf_image_format(rf_image image, rf_uncompressed_pixel_format new_format, rf_allocator allocator)
{
    rf_image result = {0};

    if (image.valid)
    {
        if (rf_is_uncompressed_format(new_format) && rf_is_uncompressed_format(image.format))
        {
            int dst_size = image.width * image.height * rf_bytes_per_pixel(image.format);
            void* dst = RF_ALLOC(allocator, dst_size);

            if (dst)
            {
                bool format_success = rf_format_pixels(image.data, rf_image_size(image), image.format, dst, dst_size, new_format);
                RF_ASSERT(format_success);

                result = (rf_image)
                {
                    .data = dst,
                    .width = image.width,
                    .height = image.height,
                    .format = new_format,
                    .valid = true,
                };
            }
            else RF_LOG_ERROR(RF_BAD_ALLOC, "Allocation of size %d failed.", dst_size);
        }
        else RF_LOG_ERROR(RF_BAD_ARGUMENT, "Cannot format compressed pixel formats. `image.format`: %d, `dst_format`: %d", image.format, new_format);
    }
    else RF_LOG_ERROR(RF_BAD_ARGUMENT, "Image is invalid.");

    return result;
}